

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

void proto2_unittest::TestParsingMergeLite_RepeatedGroup::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  TestParsingMergeLite_RepeatedGroup **v1;
  TestParsingMergeLite_RepeatedGroup **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  TestAllTypesLite *pTVar4;
  LogMessage local_90;
  Voidify local_79;
  uint local_78;
  uint32_t cached_has_bits;
  LogMessage local_68;
  Voidify local_51;
  TestParsingMergeLite_RepeatedGroup *local_50;
  Nullable<const_char_*> local_48;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  TestParsingMergeLite_RepeatedGroup *from;
  TestParsingMergeLite_RepeatedGroup *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_10;
  
  arena = (Arena *)from_msg;
  from = (TestParsingMergeLite_RepeatedGroup *)to_msg;
  _this = (TestParsingMergeLite_RepeatedGroup *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)google::protobuf::MessageLite::GetArena(to_msg);
  local_50 = (TestParsingMergeLite_RepeatedGroup *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite_RepeatedGroup_const*>(&local_50);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<proto2_unittest::TestParsingMergeLite_RepeatedGroup*>(&from);
  local_48 = absl::lts_20250127::log_internal::
             Check_NEImpl<proto2_unittest::TestParsingMergeLite_RepeatedGroup_const*,proto2_unittest::TestParsingMergeLite_RepeatedGroup*>
                       (v1,v2,"&from != _this");
  if (local_48 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_48);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
               ,0x20ff,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  local_78 = 0;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_78 = *puVar3;
  if ((local_78 & 1) != 0) {
    if ((arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_lite.pb.cc"
                 ,0x2105,"from._impl_.repeated_group_all_types_ != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    if ((from->field_0)._impl_.repeated_group_all_types_ == (TestAllTypesLite *)0x0) {
      to_msg_local = (MessageLite *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i;
      local_10 = absl_log_internal_check_op_result;
      pTVar4 = (TestAllTypesLite *)
               google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                         ((Arena *)absl_log_internal_check_op_result,to_msg_local);
      (from->field_0)._impl_.repeated_group_all_types_ = pTVar4;
    }
    else {
      TestAllTypesLite::MergeFrom
                ((from->field_0)._impl_.repeated_group_all_types_,
                 (TestAllTypesLite *)(arena->impl_).mutex_.mu_.super___atomic_base<long>._M_i);
    }
  }
  uVar1 = local_78;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(from->super_MessageLite)._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void TestParsingMergeLite_RepeatedGroup::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestParsingMergeLite_RepeatedGroup*>(&to_msg);
  auto& from = static_cast<const TestParsingMergeLite_RepeatedGroup&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    ABSL_DCHECK(from._impl_.repeated_group_all_types_ != nullptr);
    if (_this->_impl_.repeated_group_all_types_ == nullptr) {
      _this->_impl_.repeated_group_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.repeated_group_all_types_);
    } else {
      _this->_impl_.repeated_group_all_types_->MergeFrom(*from._impl_.repeated_group_all_types_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}